

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

void glfwGetMonitorWorkarea(GLFWmonitor *handle,int *xpos,int *ypos,int *width,int *height)

{
  int iVar1;
  int iVar2;
  XRRScreenResources *pXVar3;
  XRRCrtcInfo *pXVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  XRRModeInfo *pXVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  _GLFWmonitor *monitor;
  int iVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  ulong *puStack_50;
  uchar *puStack_48;
  int *piStack_40;
  int *piStack_38;
  
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (width != (int *)0x0) {
    *width = 0;
  }
  if (height != (int *)0x0) {
    *height = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_40 = xpos;
  piStack_38 = ypos;
  if ((_glfw.x11.randr.available == 0) || (_glfw.x11.randr.monitorBroken != 0)) {
    iVar14 = *(int *)(*(long *)(_glfw.x11.display + 0xe8) + 0x18 + (long)_glfw.x11.screen * 0x80);
    iVar11 = *(int *)(*(long *)(_glfw.x11.display + 0xe8) + 0x1c + (long)_glfw.x11.screen * 0x80);
    iVar10 = 0;
    iVar15 = 0;
  }
  else {
    pXVar3 = (*_glfw.x11.randr.GetScreenResourcesCurrent)(_glfw.x11.display,_glfw.x11.root);
    pXVar4 = (*_glfw.x11.randr.GetCrtcInfo)(_glfw.x11.display,pXVar3,*(RRCrtc *)(handle + 0x108));
    lVar9 = (long)pXVar3->nmode;
    if (0 < lVar9) {
      pXVar7 = pXVar3->modes;
      do {
        if (pXVar7->id == pXVar4->mode) goto LAB_0022546c;
        pXVar7 = pXVar7 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    pXVar7 = (XRRModeInfo *)0x0;
LAB_0022546c:
    lVar9 = 8;
    lVar12 = 0xc;
    if ((pXVar4->rotation != 2) && (pXVar4->rotation != 8)) {
      lVar9 = 0xc;
      lVar12 = 8;
    }
    iVar15 = pXVar4->x;
    iVar10 = pXVar4->y;
    iVar14 = *(int *)((long)&pXVar7->id + lVar12);
    iVar11 = *(int *)((long)&pXVar7->id + lVar9);
    (*_glfw.x11.randr.FreeCrtcInfo)(pXVar4);
    (*_glfw.x11.randr.FreeScreenResources)(pXVar3);
  }
  if ((_glfw.x11.NET_WORKAREA == 0) || (_glfw.x11.NET_CURRENT_DESKTOP == 0)) goto LAB_0022562f;
  puStack_48 = (uchar *)0x0;
  puStack_50 = (ulong *)0x0;
  uVar5 = _glfwGetWindowPropertyX11(_glfw.x11.root,_glfw.x11.NET_WORKAREA,6,&puStack_48);
  uVar6 = _glfwGetWindowPropertyX11
                    (_glfw.x11.root,_glfw.x11.NET_CURRENT_DESKTOP,6,(uchar **)&puStack_50);
  if ((uVar6 == 0 || uVar5 < 4) || (uVar5 >> 2 <= *puStack_50)) {
    if (puStack_48 != (uchar *)0x0) goto LAB_0022561b;
  }
  else {
    lVar9 = *puStack_50 * 0x20;
    iVar1 = *(int *)(puStack_48 + lVar9);
    iVar2 = *(int *)(puStack_48 + lVar9 + 8);
    iVar13 = iVar15 - iVar1;
    bVar16 = iVar13 == 0;
    if (iVar1 <= iVar15) {
      iVar13 = 0;
    }
    if (bVar16 || iVar15 < iVar1) {
      iVar15 = iVar1;
    }
    iVar13 = iVar13 + iVar14;
    iVar8 = iVar10 - iVar2;
    bVar16 = iVar8 == 0;
    if (iVar2 <= iVar10) {
      iVar8 = 0;
    }
    if (bVar16 || iVar10 < iVar2) {
      iVar10 = iVar2;
    }
    iVar8 = iVar8 + iVar11;
    iVar14 = (iVar1 - iVar15) + *(int *)(puStack_48 + lVar9 + 0x10);
    if (iVar13 + iVar15 <= *(int *)(puStack_48 + lVar9 + 0x10) + iVar1) {
      iVar14 = iVar13;
    }
    iVar11 = (iVar2 - iVar10) + *(int *)(puStack_48 + lVar9 + 0x18);
    if (iVar8 + iVar10 <= *(int *)(puStack_48 + lVar9 + 0x18) + iVar2) {
      iVar11 = iVar8;
    }
LAB_0022561b:
    XFree();
  }
  if (puStack_50 != (ulong *)0x0) {
    XFree();
  }
LAB_0022562f:
  if (piStack_40 != (int *)0x0) {
    *piStack_40 = iVar15;
  }
  if (piStack_38 != (int *)0x0) {
    *piStack_38 = iVar10;
  }
  if (width != (int *)0x0) {
    *width = iVar14;
  }
  if (height != (int *)0x0) {
    *height = iVar11;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorWorkarea(GLFWmonitor* handle,
                                    int* xpos, int* ypos,
                                    int* width, int* height)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;
    if (width)
        *width = 0;
    if (height)
        *height = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorWorkarea(monitor, xpos, ypos, width, height);
}